

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModportExplicitPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportExplicitPortSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax **args_3,
          Token *args_4)

{
  ExpressionSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  ModportExplicitPortSyntax *pMVar22;
  
  pMVar22 = (ModportExplicitPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportExplicitPortSyntax *)this->endPtr < pMVar22 + 1) {
    pMVar22 = (ModportExplicitPortSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pMVar22 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar2 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar4 = args_2->info;
  pEVar1 = *args_3;
  TVar18 = args_4->kind;
  uVar19 = args_4->field_0x2;
  NVar20.raw = (args_4->numFlags).raw;
  uVar21 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pMVar22->super_ModportPortSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar22->super_ModportPortSyntax).super_SyntaxNode.kind = ModportExplicitPort;
  (pMVar22->dot).kind = TVar6;
  (pMVar22->dot).field_0x2 = uVar7;
  (pMVar22->dot).numFlags = (NumericTokenFlags)NVar8.raw;
  (pMVar22->dot).rawLen = uVar9;
  (pMVar22->dot).info = pIVar2;
  (pMVar22->name).kind = TVar10;
  (pMVar22->name).field_0x2 = uVar11;
  (pMVar22->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (pMVar22->name).rawLen = uVar13;
  (pMVar22->name).info = pIVar3;
  (pMVar22->openParen).kind = TVar14;
  (pMVar22->openParen).field_0x2 = uVar15;
  (pMVar22->openParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (pMVar22->openParen).rawLen = uVar17;
  (pMVar22->openParen).info = pIVar4;
  pMVar22->expr = pEVar1;
  (pMVar22->closeParen).kind = TVar18;
  (pMVar22->closeParen).field_0x2 = uVar19;
  (pMVar22->closeParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (pMVar22->closeParen).rawLen = uVar21;
  (pMVar22->closeParen).info = pIVar5;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pMVar22;
  }
  return pMVar22;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }